

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double eps(double x)

{
  double dVar1;
  
  dVar1 = -x;
  if (-x <= x) {
    dVar1 = x;
  }
  dVar1 = log((double)(~-(ulong)(0.0 < dVar1) & (ulong)dVar1 |
                      (~-(ulong)(dVar1 < 1.0) & (ulong)dVar1 |
                      (ulong)(dVar1 * 0.5) & -(ulong)(dVar1 < 1.0)) & -(ulong)(0.0 < dVar1)));
  dVar1 = ldexp(1.0,(int)(dVar1 / 0.6931471805599453));
  return dVar1 * 2.220446049250313e-16;
}

Assistant:

double eps(double x) {
	double y,t,epsv;
	int t2;
	
	epsv = pow(2.0,-52.0);
	if (x < 0.) {
		x = - x;
	}
	
	if ( x > 0. && x < 1.0) {
		x /= 2.;
	}
	t2 = (int) ( log(x) / log ((double) 2.0));
	t = pow(2.0,(double) t2);
	
	y = epsv * t;
	return y;
}